

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O2

void __thiscall
MakefileGenerator::writeMakeQmake(MakefileGenerator *this,QTextStream *t,bool noDummyQmakeAll)

{
  QMakeProject *pQVar1;
  char16_t *pcVar2;
  ProString *pPVar3;
  QString file;
  undefined8 uVar4;
  bool bVar5;
  QTextStream *pQVar6;
  ProStringList *pPVar7;
  undefined4 uVar8;
  undefined7 in_register_00000011;
  long lVar9;
  int include;
  ulong uVar10;
  long in_FS_OFFSET;
  undefined4 in_stack_fffffffffffffe98;
  char cVar11;
  undefined1 in_stack_fffffffffffffea0 [16];
  QArrayDataPointer<char16_t> local_148;
  QArrayDataPointer<char16_t> local_130;
  QArrayDataPointer<char16_t> local_118;
  QArrayDataPointer<char16_t> local_f8;
  QArrayDataPointer<QString> local_d8;
  undefined1 local_b8 [48];
  undefined1 local_88 [32];
  char (*local_68) [11];
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  uVar8 = (undefined4)CONCAT71(in_register_00000011,noDummyQmakeAll);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.size = -0x5555555555555556;
  local_58.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_58.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  QFile::fileName();
  fileFixify((QString *)&local_58,this,(QString *)local_88,(FileFixifyTypes)0x0,true);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
  pQVar1 = this->project;
  ProKey::ProKey((ProKey *)local_88,"QMAKE_FAILED_REQUIREMENTS");
  bVar5 = QMakeProject::isEmpty(pQVar1,(ProKey *)local_88);
  if (bVar5) {
    pQVar1 = this->project;
    ProKey::ProKey((ProKey *)local_b8,"QMAKE_INTERNAL_PRL_FILE");
    bVar5 = QMakeProject::isEmpty(pQVar1,(ProKey *)local_b8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_b8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
    if (!bVar5) {
      local_d8.size = -0x5555555555555556;
      local_d8.d = (Data *)0xaaaaaaaaaaaaaaaa;
      local_d8.ptr = (QString *)0xaaaaaaaaaaaaaaaa;
      fileFixify((QStringList *)local_88,this,&Option::mkfile::project_files,(FileFixifyTypes)0x0,
                 true);
      escapeFilePaths((QStringList *)&local_d8,this,(QStringList *)local_88);
      QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)local_88);
      pQVar1 = this->project;
      ProKey::ProKey((ProKey *)local_b8,"QMAKE_INTERNAL_PRL_FILE");
      QMakeEvaluator::first((ProString *)local_88,&pQVar1->super_QMakeEvaluator,(ProKey *)local_b8);
      ProString::toQString((QString *)&local_118,(ProString *)local_88);
      (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xd])(&local_f8,this,&local_118)
      ;
      pQVar6 = (QTextStream *)QTextStream::operator<<(t,(QString *)&local_f8);
      pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6,": \n\t");
      pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6,"@$(QMAKE) -prl ");
      QListSpecialMethods<QString>::join
                ((QString *)&local_130,(QListSpecialMethods<QString> *)&local_d8,(QChar)0x20);
      pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6,(QString *)&local_130);
      pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6,' ');
      buildArgs((QString *)&local_148,this,true);
      pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6,(QString *)&local_148);
      Qt::endl(pQVar6);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_148);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_130);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_118);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_b8);
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_d8);
    }
  }
  else {
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
  }
  local_d8.size = -0x5555555555555556;
  local_d8.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_d8.ptr = (QString *)0xaaaaaaaaaaaaaaaa;
  fullBuildArgs((QString *)local_b8,this);
  local_88._24_8_ = local_b8._16_8_;
  local_88._16_8_ = local_b8._8_8_;
  local_88._8_8_ = local_b8._0_8_;
  local_88._0_8_ = "$(QMAKE)";
  local_b8._0_8_ = (Data *)0x0;
  local_b8._8_8_ = (ProString *)0x0;
  local_b8._16_8_ = 0;
  QStringBuilder<const_char_(&)[9],_QString>::convertTo<QString>
            ((QString *)&local_d8,(QStringBuilder<const_char_(&)[9],_QString> *)local_88);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)(local_88 + 8));
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_b8);
  if (local_58.size != 0) {
    pQVar1 = this->project;
    QString::QString((QString *)local_88,"no_autoqmake");
    bVar5 = QMakeProject::isActiveConfig(pQVar1,(QString *)local_88,false);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
    if (!bVar5) {
      (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xd])(local_88,this,&local_58);
      pQVar6 = (QTextStream *)QTextStream::operator<<(t,(QString *)local_88);
      pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6,": ");
      pQVar1 = this->project;
      local_118.d = (pQVar1->m_projectFile).d.d;
      local_118.ptr = (pQVar1->m_projectFile).d.ptr;
      local_118.size = (pQVar1->m_projectFile).d.size;
      if (local_118.d != (Data *)0x0) {
        LOCK();
        ((local_118.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_118.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      fileFixify((QString *)&local_f8,this,(QString *)&local_118,(FileFixifyTypes)0x0,true);
      (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xd])
                ((QArrayDataPointer<char16_t> *)local_b8,this,&local_f8);
      pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6,(QString *)local_b8);
      QTextStream::operator<<(pQVar6," ");
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_b8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_118);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
      if (Option::globals->do_cache == true) {
        pQVar1 = this->project;
        local_88._0_8_ = (pQVar1->super_QMakeEvaluator).m_conffile.d.d;
        local_88._8_8_ = (pQVar1->super_QMakeEvaluator).m_conffile.d.ptr;
        pcVar2 = (char16_t *)(pQVar1->super_QMakeEvaluator).m_conffile.d.size;
        if ((Data *)local_88._0_8_ != (Data *)0x0) {
          LOCK();
          (((Data *)local_88._0_8_)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (((Data *)local_88._0_8_)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + 1;
          UNLOCK();
        }
        local_88._16_8_ = pcVar2;
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
        if (pcVar2 != (char16_t *)0x0) {
          pQVar1 = this->project;
          local_f8.d = (pQVar1->super_QMakeEvaluator).m_conffile.d.d;
          local_f8.ptr = (pQVar1->super_QMakeEvaluator).m_conffile.d.ptr;
          local_f8.size = (pQVar1->super_QMakeEvaluator).m_conffile.d.size;
          if (local_f8.d != (Data *)0x0) {
            LOCK();
            ((local_f8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_f8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          fileFixify((QString *)local_b8,this,(QString *)&local_f8,(FileFixifyTypes)0x0,true);
          (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xd])
                    ((QArrayDataPointer<char16_t> *)local_88,this,
                     (QArrayDataPointer<char16_t> *)local_b8);
          pQVar6 = (QTextStream *)QTextStream::operator<<(t,(QString *)local_88);
          QTextStream::operator<<(pQVar6," ");
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_b8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f8);
        }
        pQVar1 = this->project;
        local_88._0_8_ = (pQVar1->super_QMakeEvaluator).m_cachefile.d.d;
        local_88._8_8_ = (pQVar1->super_QMakeEvaluator).m_cachefile.d.ptr;
        pPVar3 = (ProString *)(pQVar1->super_QMakeEvaluator).m_cachefile.d.size;
        if ((Data *)local_88._0_8_ != (Data *)0x0) {
          LOCK();
          (((Data *)local_88._0_8_)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (((Data *)local_88._0_8_)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + 1;
          UNLOCK();
        }
        local_88._16_8_ = pPVar3;
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
        if (pPVar3 != (ProString *)0x0) {
          pQVar1 = this->project;
          local_f8.d = (pQVar1->super_QMakeEvaluator).m_cachefile.d.d;
          local_f8.ptr = (pQVar1->super_QMakeEvaluator).m_cachefile.d.ptr;
          local_f8.size = (pQVar1->super_QMakeEvaluator).m_cachefile.d.size;
          if (local_f8.d != (Data *)0x0) {
            LOCK();
            ((local_f8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_f8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          fileFixify((QString *)local_b8,this,(QString *)&local_f8,(FileFixifyTypes)0x0,true);
          (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xd])
                    ((QArrayDataPointer<char16_t> *)local_88,this,
                     (QArrayDataPointer<char16_t> *)local_b8);
          pQVar6 = (QTextStream *)QTextStream::operator<<(t,(QString *)local_88);
          QTextStream::operator<<(pQVar6," ");
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_b8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f8);
        }
      }
      specdir((QString *)local_88,this);
      uVar4 = local_88._16_8_;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
      if ((ProString *)uVar4 != (ProString *)0x0) {
        specdir((QString *)&local_f8,this);
        local_88._16_8_ = local_f8.size;
        local_88._8_8_ = local_f8.ptr;
        local_88._0_8_ = local_f8.d;
        local_f8.d = (Data *)0x0;
        local_f8.ptr = (char16_t *)0x0;
        local_f8.size = 0;
        local_88._24_8_ = "/qmake.conf";
        QStringBuilder<QString,_const_char_(&)[12]>::convertTo<QString>
                  ((QString *)local_b8,(QStringBuilder<QString,_const_char_(&)[12]> *)local_88);
        Option::normalizePath((QString *)&stack0xfffffffffffffea0,(QString *)local_b8,true,true);
        file.d.d._4_4_ = uVar8;
        file.d.d._0_4_ = in_stack_fffffffffffffe98;
        file.d.ptr = (char16_t *)in_stack_fffffffffffffea0._0_8_;
        file.d.size = in_stack_fffffffffffffea0._8_8_;
        bVar5 = exists(this,file);
        QArrayDataPointer<char16_t>::~QArrayDataPointer
                  ((QArrayDataPointer<char16_t> *)&stack0xfffffffffffffea0);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_b8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f8);
        if (bVar5) {
          specdir((QString *)&local_118,this);
          local_b8._16_8_ = local_118.size;
          local_b8._8_8_ = local_118.ptr;
          local_b8._0_8_ = local_118.d;
          local_118.d = (Data *)0x0;
          local_118.ptr = (char16_t *)0x0;
          local_118.size = 0;
          local_b8._24_8_ = &Option::dir_sep;
          QStringBuilder<QString,_QString_&>::QStringBuilder
                    ((QStringBuilder<QString,_QString_&> *)local_88,
                     (QStringBuilder<QString,_QString_&> *)local_b8);
          local_68 = (char (*) [11])0x225260;
          escapeDependencyPath<QStringBuilder<QString,QString&>,char_const(&)[11]>
                    ((QString *)&local_f8,this,
                     (QStringBuilder<QStringBuilder<QString,_QString_&>,_const_char_(&)[11]> *)
                     local_88);
          pQVar6 = (QTextStream *)QTextStream::operator<<(t,(QString *)&local_f8);
          QTextStream::operator<<(pQVar6," ");
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_b8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_118);
        }
      }
      pQVar1 = this->project;
      ProKey::ProKey((ProKey *)local_88,"QMAKE_INTERNAL_INCLUDED_FILES");
      pPVar7 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)local_88);
      escapeDependencyPaths((ProStringList *)local_b8,this,pPVar7);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
      QString::QString((QString *)&local_f8," \\\n\t\t");
      ProStringList::join((QString *)local_88,(ProStringList *)local_b8,(QString *)&local_f8);
      pQVar6 = (QTextStream *)QTextStream::operator<<(t,(QString *)local_88);
      pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6,"\n\t");
      pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6,(QString *)&local_d8);
      Qt::endl(pQVar6);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f8);
      pQVar1 = this->project;
      ProKey::ProKey((ProKey *)local_88,"QMAKE_MAKE_QMAKE_EXTRA_COMMANDS");
      pPVar7 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)local_88);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
      if ((pPVar7->super_QList<ProString>).d.size != 0) {
        pQVar6 = (QTextStream *)QTextStream::operator<<(t,"\t");
        QString::QString((QString *)&local_f8,"\n\t");
        ProStringList::join((QString *)local_88,pPVar7,(QString *)&local_f8);
        pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6,(QString *)local_88);
        Qt::endl(pQVar6);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f8);
      }
      lVar9 = 0;
      for (uVar10 = 0; uVar10 < (ulong)local_b8._16_8_; uVar10 = uVar10 + 1) {
        if (*(int *)((long)(local_b8._8_8_ + 0x1c) + lVar9) != 0) {
          pQVar6 = operator<<(t,(ProString *)((long)&(((QString *)local_b8._8_8_)->d).d + lVar9));
          QTextStream::operator<<(pQVar6,":\n");
        }
        lVar9 = lVar9 + 0x30;
      }
      QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)local_b8);
    }
  }
  cVar11 = (char)uVar8;
  pQVar1 = this->project;
  ProKey::ProKey((ProKey *)local_b8,"QMAKE_ORIG_TARGET");
  QMakeEvaluator::first((ProString *)local_88,&pQVar1->super_QMakeEvaluator,(ProKey *)local_b8);
  bVar5 = ProString::operator!=((ProString *)local_88,"qmake");
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_b8);
  if (bVar5) {
    pQVar6 = (QTextStream *)QTextStream::operator<<(t,"qmake: FORCE\n\t@");
    pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6,(QString *)&local_d8);
    pQVar6 = (QTextStream *)Qt::endl(pQVar6);
    Qt::endl(pQVar6);
    if (cVar11 == '\0') {
      QTextStream::operator<<(t,"qmake_all: FORCE\n\n");
    }
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_d8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void
MakefileGenerator::writeMakeQmake(QTextStream &t, bool noDummyQmakeAll)
{
    QString ofile = fileFixify(Option::output.fileName());
    if(project->isEmpty("QMAKE_FAILED_REQUIREMENTS") && !project->isEmpty("QMAKE_INTERNAL_PRL_FILE")) {
        QStringList files = escapeFilePaths(fileFixify(Option::mkfile::project_files));
        t << escapeDependencyPath(project->first("QMAKE_INTERNAL_PRL_FILE").toQString()) << ": \n\t"
          << "@$(QMAKE) -prl " << files.join(' ') << ' ' << buildArgs(true) << Qt::endl;
    }

        QString qmake = "$(QMAKE)" + fullBuildArgs();
        if(!ofile.isEmpty() && !project->isActiveConfig("no_autoqmake")) {
            t << escapeDependencyPath(ofile) << ": "
              << escapeDependencyPath(fileFixify(project->projectFile())) << " ";
            if (Option::globals->do_cache) {
                if (!project->confFile().isEmpty())
                    t <<  escapeDependencyPath(fileFixify(project->confFile())) << " ";
                if (!project->cacheFile().isEmpty())
                    t <<  escapeDependencyPath(fileFixify(project->cacheFile())) << " ";
            }
            if(!specdir().isEmpty()) {
                if (exists(Option::normalizePath(specdir() + "/qmake.conf")))
                    t << escapeDependencyPath(specdir() + Option::dir_sep + "qmake.conf") << " ";
            }
            const ProStringList &included = escapeDependencyPaths(project->values("QMAKE_INTERNAL_INCLUDED_FILES"));
            t << included.join(QString(" \\\n\t\t")) << "\n\t"
              << qmake << Qt::endl;
            const ProStringList &extraCommands = project->values("QMAKE_MAKE_QMAKE_EXTRA_COMMANDS");
            if (!extraCommands.isEmpty())
                t << "\t" << extraCommands.join(QString("\n\t")) << Qt::endl;
            for(int include = 0; include < included.size(); ++include) {
                const ProString &i = included.at(include);
                if(!i.isEmpty())
                    t << i << ":\n";
            }
        }
        if(project->first("QMAKE_ORIG_TARGET") != "qmake") {
            t << "qmake: FORCE\n\t@" << qmake << Qt::endl << Qt::endl;
            if (!noDummyQmakeAll)
                t << "qmake_all: FORCE\n\n";
        }
}